

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceSpanTask::takedown(search *sch,multi_ex *ec)

{
  task_data *ptVar1;
  size_type sVar2;
  reference ppeVar3;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  label_t ylab;
  size_t n;
  task_data *D;
  action local_28;
  ulong local_20;
  
  ptVar1 = Search::search::get_task_data<SequenceSpanTask::task_data>(in_RDI);
  if (ptVar1->encoding == BILOU) {
    for (local_20 = 0; sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI),
        local_20 < sVar2; local_20 = local_20 + 1) {
      ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_20);
      local_28 = ((*ppeVar3)->l).multi.label;
      bilou_to_bio(local_28);
    }
  }
  return;
}

Assistant:

void takedown(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();

  if (D.encoding == BILOU)
    for (size_t n = 0; n < ec.size(); n++)
    {
      MULTICLASS::label_t ylab = ec[n]->l.multi;
      ylab.label = bilou_to_bio(ylab.label);
    }
}